

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O1

bool __thiscall M7Getter::AddAlgoFrequencies(M7Getter *this,TldDSAsKey *key)

{
  pointer *ppp_Var1;
  size_t sVar2;
  pointer pp_Var3;
  iterator __position;
  _st_m7_algo_count_t *p_Var4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  m7_algo_count_t *algo_val;
  _st_m7_algo_count_t *local_38;
  
  dVar8 = 0.0;
  if ((ulong)key->algo_nb != 0) {
    uVar5 = 0;
    do {
      dVar8 = dVar8 + (double)key->algo_count[uVar5];
      uVar5 = uVar5 + 1;
    } while (key->algo_nb != uVar5);
  }
  if (key->algo_nb != 0) {
    sVar2 = key->name_len;
    uVar5 = 0;
    do {
      dVar9 = (double)key->algo_count[uVar5] / dVar8;
      pp_Var3 = (this->algo_count).
                super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      __position._M_current =
           (this->algo_count).
           super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      lVar6 = (long)__position._M_current - (long)pp_Var3;
      if (lVar6 != 0) {
        lVar6 = lVar6 >> 3;
        lVar7 = 0;
        do {
          p_Var4 = pp_Var3[lVar7];
          if (p_Var4->algo_code == key->algo_code[uVar5]) {
            p_Var4->algo_frequency = p_Var4->algo_frequency + dVar9;
            if (sVar2 == 2) {
              p_Var4->algo_frequency_cc = dVar9 + p_Var4->algo_frequency_cc;
            }
            goto LAB_0016ca24;
          }
          lVar7 = lVar7 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
      }
      local_38 = (_st_m7_algo_count_t *)operator_new(0x18);
      local_38->algo_code = key->algo_code[uVar5];
      local_38->algo_frequency = dVar9;
      if (sVar2 != 2) {
        dVar9 = 0.0;
      }
      local_38->algo_frequency_cc = dVar9;
      if (__position._M_current ==
          (this->algo_count).
          super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<_st_m7_algo_count_t*,std::allocator<_st_m7_algo_count_t*>>::
        _M_realloc_insert<_st_m7_algo_count_t*const&>
                  ((vector<_st_m7_algo_count_t*,std::allocator<_st_m7_algo_count_t*>> *)
                   &this->algo_count,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        ppp_Var1 = &(this->algo_count).
                    super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *ppp_Var1 = *ppp_Var1 + 1;
      }
LAB_0016ca24:
      uVar5 = uVar5 + 1;
    } while (uVar5 < key->algo_nb);
  }
  return true;
}

Assistant:

bool M7Getter::AddAlgoFrequencies(TldDSAsKey* key)
{
    bool ret = true;
    double total = 0;
    bool is_cc = (key->name_len == 2);

    for (uint32_t i = 0; i < key->algo_nb; i++) {
        total += key->algo_count[i];
    }
    for (uint32_t i = 0; i < key->algo_nb; i++) {
        bool found = false;
        double frequency = ((double)key->algo_count[i]) / total;
        for (size_t j = 0; j < algo_count.size(); j++) {
            if (algo_count[j]->algo_code == key->algo_code[i]) {
                algo_count[j]->algo_frequency += frequency;
                if (is_cc) {
                    algo_count[j]->algo_frequency_cc += frequency;
                }
                found = true;
                break;
            }
        }
        if (!found) {
            m7_algo_count_t * algo_val = new m7_algo_count_t;
                
            algo_val->algo_code = key->algo_code[i];
            algo_val->algo_frequency = frequency;
            algo_val->algo_frequency_cc = (is_cc) ? frequency : 0.0;
            this->algo_count.push_back(algo_val);
        }
    }

    return ret;
}